

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

void __thiscall
Rml::DataViewAttribute::DataViewAttribute
          (DataViewAttribute *this,Element *element,String *override_attribute,int sort_offset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type *local_30;
  size_type local_20;
  undefined8 uStack_18;
  
  local_30 = (size_type *)(override_attribute->_M_dataplus)._M_p;
  paVar1 = &override_attribute->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined8 *)((long)&override_attribute->field_2 + 8);
    local_30 = &local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = override_attribute->_M_string_length;
  (override_attribute->_M_dataplus)._M_p = (pointer)paVar1;
  override_attribute->_M_string_length = 0;
  (override_attribute->field_2)._M_local_buf[0] = '\0';
  DataView::DataView((DataView *)this,element,sort_offset);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_003345e8;
  paVar1 = &(this->super_DataViewCommon).modifier.field_2;
  (this->super_DataViewCommon).modifier._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = local_20;
    *(undefined8 *)((long)&(this->super_DataViewCommon).modifier.field_2 + 8) = uStack_18;
  }
  else {
    (this->super_DataViewCommon).modifier._M_dataplus._M_p = (pointer)local_30;
    (this->super_DataViewCommon).modifier.field_2._M_allocated_capacity = local_20;
  }
  (this->super_DataViewCommon).modifier._M_string_length = sVar2;
  (this->super_DataViewCommon).expression._M_t.
  super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
  super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl = (DataExpression *)0x0;
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_00334628;
  return;
}

Assistant:

DataViewAttribute::DataViewAttribute(Element* element, String override_attribute, int sort_offset) :
	DataViewCommon(element, std::move(override_attribute), sort_offset)
{}